

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  element_type *peVar6;
  element_type *peVar7;
  ostream *this;
  byte local_12f;
  shared_ptr<SchemeInt> local_128;
  shared_ptr<SchemeObject> local_118;
  byte local_104;
  byte local_103;
  byte local_102;
  allocator local_101;
  string local_100 [32];
  undefined1 local_e0 [40];
  shared_ptr<SchemeObject> local_b8;
  byte local_a5;
  undefined4 local_a4;
  shared_ptr<SchemeInt> local_a0;
  byte local_8c;
  byte local_8b;
  byte local_8a;
  allocator local_89;
  string local_88 [32];
  string local_68;
  byte local_42;
  allocator local_41;
  string local_40 [32];
  shared_ptr<SchemeObject> local_20;
  undefined4 local_c;
  
  local_c = 0;
  bVar3 = std::operator==(&scheme_true,&scheme_false);
  local_42 = 0;
  local_68.field_2._M_local_buf[3] = 0;
  local_68.field_2._M_local_buf[2] = 0;
  local_8a = 0;
  local_8b = 0;
  local_8c = 0;
  local_a5 = 0;
  local_e0[0x13] = 0;
  local_e0[0x12] = 0;
  local_102 = 0;
  local_103 = 0;
  local_104 = 0;
  bVar2 = false;
  bVar1 = false;
  local_12f = 1;
  if (!bVar3) {
    peVar6 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&scheme_true);
    uVar4 = (*peVar6->_vptr_SchemeObject[6])(peVar6,&scheme_false);
    local_12f = 1;
    if ((uVar4 & 1) == 0) {
      peVar6 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&scheme_false);
      uVar4 = (*peVar6->_vptr_SchemeObject[6])(peVar6,&scheme_true);
      local_12f = 1;
      if ((uVar4 & 1) == 0) {
        std::allocator<char>::allocator();
        local_42 = 1;
        std::__cxx11::string::string(local_40,"#t",&local_41);
        local_68.field_2._M_local_buf[3] = 1;
        evaluate_string_in_global_context((string *)&local_20);
        local_68.field_2._M_local_buf[2] = 1;
        bVar3 = std::operator!=(&local_20,&scheme_true);
        local_12f = 1;
        if (!bVar3) {
          std::allocator<char>::allocator();
          local_8a = 1;
          std::__cxx11::string::string(local_88,"#f",&local_89);
          local_8b = 1;
          evaluate_string_in_global_context(&local_68);
          local_8c = 1;
          bVar3 = std::operator!=((shared_ptr<SchemeObject> *)&local_68,&scheme_false);
          local_12f = 1;
          if (!bVar3) {
            local_a4 = 5;
            std::make_shared<SchemeInt,int>((int *)&local_a0);
            local_a5 = 1;
            peVar7 = std::__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<SchemeInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&local_a0);
            local_e0._20_4_ = 6;
            std::make_shared<SchemeInt,int>((int *)(local_e0 + 0x18));
            local_e0[0x13] = 1;
            std::shared_ptr<SchemeObject>::shared_ptr<SchemeInt,void>
                      (&local_b8,(shared_ptr<SchemeInt> *)(local_e0 + 0x18));
            local_e0[0x12] = 1;
            uVar4 = (*(peVar7->super_SchemeObject)._vptr_SchemeObject[6])(peVar7,&local_b8);
            local_12f = 1;
            if ((uVar4 & 1) == 0) {
              std::allocator<char>::allocator();
              local_102 = 1;
              std::__cxx11::string::string(local_100,"8",&local_101);
              local_103 = 1;
              evaluate_string_in_global_context((string *)local_e0);
              local_104 = 1;
              peVar6 = std::
                       __shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_e0);
              std::make_shared<SchemeInt,int>((int *)&local_128);
              bVar2 = true;
              std::shared_ptr<SchemeObject>::shared_ptr<SchemeInt,void>(&local_118,&local_128);
              bVar1 = true;
              iVar5 = (*peVar6->_vptr_SchemeObject[6])(peVar6,&local_118);
              local_12f = (byte)iVar5 ^ 0xff;
            }
          }
        }
      }
    }
  }
  if (bVar1) {
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_118);
  }
  if (bVar2) {
    std::shared_ptr<SchemeInt>::~shared_ptr(&local_128);
  }
  if ((local_104 & 1) != 0) {
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_e0);
  }
  if ((local_103 & 1) != 0) {
    std::__cxx11::string::~string(local_100);
  }
  if ((local_102 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  if ((local_e0[0x12] & 1) != 0) {
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_b8);
  }
  if ((local_e0[0x13] & 1) != 0) {
    std::shared_ptr<SchemeInt>::~shared_ptr((shared_ptr<SchemeInt> *)(local_e0 + 0x18));
  }
  if ((local_a5 & 1) != 0) {
    std::shared_ptr<SchemeInt>::~shared_ptr(&local_a0);
  }
  if ((local_8c & 1) != 0) {
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)&local_68);
  }
  if ((local_8b & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  if ((local_8a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  if ((local_68.field_2._M_local_buf[2] & 1U) != 0) {
    std::shared_ptr<SchemeObject>::~shared_ptr(&local_20);
  }
  if ((local_68.field_2._M_local_buf[3] & 1U) != 0) {
    std::__cxx11::string::~string(local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  if ((local_12f & 1) != 0) {
    this = std::operator<<((ostream *)&std::cout,"Something weird happened");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  test_basic();
  test_special_forms();
  test_equality();
  test_math();
  test_strings();
  test_lists();
  test_vectors();
  test_misc();
  test_procedures();
  test_io();
  return local_c;
}

Assistant:

int main()
{
    if(scheme_true == scheme_false || scheme_true->is_eq(scheme_false) || scheme_false->is_eq(scheme_true) ||
       evaluate_string_in_global_context("#t") != scheme_true ||
       evaluate_string_in_global_context("#f") != scheme_false ||
       std::make_shared<SchemeInt>(5)->is_eq(std::make_shared<SchemeInt>(6)) ||
       !evaluate_string_in_global_context("8")->is_eq(std::make_shared<SchemeInt>(8)))
    {
        std::cout << "Something weird happened" << std::endl;
        exit(1);
    }
    test_basic();
    test_special_forms();
    test_equality();
    test_math();
    test_strings();
    test_lists();
    test_vectors();
    test_misc();
    test_procedures();
    test_io();
}